

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::replace_illegal_names(CompilerGLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_2ea3;
  undefined1 local_2ea2;
  undefined1 local_2ea1;
  undefined1 *local_2ea0 [2];
  undefined1 local_2e90 [16];
  undefined1 *local_2e80 [2];
  undefined1 local_2e70 [16];
  undefined1 *local_2e60 [2];
  undefined1 local_2e50 [16];
  undefined1 *local_2e40 [2];
  undefined1 local_2e30 [16];
  undefined1 *local_2e20 [2];
  undefined1 local_2e10 [16];
  undefined1 *local_2e00 [2];
  undefined1 local_2df0 [16];
  undefined1 *local_2de0 [2];
  undefined1 local_2dd0 [16];
  undefined1 *local_2dc0 [2];
  undefined1 local_2db0 [16];
  undefined1 *local_2da0 [2];
  undefined1 local_2d90 [16];
  undefined1 *local_2d80 [2];
  undefined1 local_2d70 [16];
  undefined1 *local_2d60 [2];
  undefined1 local_2d50 [16];
  undefined1 *local_2d40 [2];
  undefined1 local_2d30 [16];
  undefined1 *local_2d20 [2];
  undefined1 local_2d10 [16];
  undefined1 *local_2d00 [2];
  undefined1 local_2cf0 [16];
  undefined1 *local_2ce0 [2];
  undefined1 local_2cd0 [16];
  undefined1 *local_2cc0 [2];
  undefined1 local_2cb0 [16];
  undefined1 *local_2ca0 [2];
  undefined1 local_2c90 [16];
  undefined1 *local_2c80 [2];
  undefined1 local_2c70 [16];
  undefined1 *local_2c60 [2];
  undefined1 local_2c50 [16];
  undefined1 *local_2c40 [2];
  undefined1 local_2c30 [16];
  undefined1 *local_2c20 [2];
  undefined1 local_2c10 [16];
  undefined1 *local_2c00 [2];
  undefined1 local_2bf0 [16];
  undefined1 *local_2be0 [2];
  undefined1 local_2bd0 [16];
  undefined1 *local_2bc0 [2];
  undefined1 local_2bb0 [16];
  undefined1 *local_2ba0 [2];
  undefined1 local_2b90 [16];
  undefined1 *local_2b80 [2];
  undefined1 local_2b70 [16];
  undefined1 *local_2b60 [2];
  undefined1 local_2b50 [16];
  undefined1 *local_2b40 [2];
  undefined1 local_2b30 [16];
  undefined1 *local_2b20 [2];
  undefined1 local_2b10 [16];
  undefined1 *local_2b00 [2];
  undefined1 local_2af0 [16];
  undefined1 *local_2ae0 [2];
  undefined1 local_2ad0 [16];
  undefined1 *local_2ac0 [2];
  undefined1 local_2ab0 [16];
  undefined1 *local_2aa0 [2];
  undefined1 local_2a90 [16];
  undefined1 *local_2a80 [2];
  undefined1 local_2a70 [16];
  undefined1 *local_2a60 [2];
  undefined1 local_2a50 [16];
  undefined1 *local_2a40 [2];
  undefined1 local_2a30 [16];
  undefined1 *local_2a20 [2];
  undefined1 local_2a10 [16];
  undefined1 *local_2a00 [2];
  undefined1 local_29f0 [16];
  undefined1 *local_29e0 [2];
  undefined1 local_29d0 [16];
  undefined1 *local_29c0 [2];
  undefined1 local_29b0 [16];
  undefined1 *local_29a0 [2];
  undefined1 local_2990 [16];
  undefined1 *local_2980 [2];
  undefined1 local_2970 [16];
  undefined1 *local_2960 [2];
  undefined1 local_2950 [16];
  undefined1 *local_2940 [2];
  undefined1 local_2930 [16];
  undefined1 *local_2920 [2];
  undefined1 local_2910 [16];
  undefined1 *local_2900 [2];
  undefined1 local_28f0 [16];
  undefined1 *local_28e0 [2];
  undefined1 local_28d0 [16];
  undefined1 *local_28c0 [2];
  undefined1 local_28b0 [16];
  undefined1 *local_28a0 [2];
  undefined1 local_2890 [16];
  undefined1 *local_2880 [2];
  undefined1 local_2870 [16];
  undefined1 *local_2860 [2];
  undefined1 local_2850 [16];
  undefined1 *local_2840 [2];
  undefined1 local_2830 [16];
  undefined1 *local_2820 [2];
  undefined1 local_2810 [16];
  undefined1 *local_2800 [2];
  undefined1 local_27f0 [16];
  undefined1 *local_27e0 [2];
  undefined1 local_27d0 [16];
  undefined1 *local_27c0 [2];
  undefined1 local_27b0 [16];
  undefined1 *local_27a0 [2];
  undefined1 local_2790 [16];
  undefined1 *local_2780 [2];
  undefined1 local_2770 [16];
  undefined1 *local_2760 [2];
  undefined1 local_2750 [16];
  undefined1 *local_2740 [2];
  undefined1 local_2730 [16];
  undefined1 *local_2720 [2];
  undefined1 local_2710 [16];
  undefined1 *local_2700 [2];
  undefined1 local_26f0 [16];
  undefined1 *local_26e0 [2];
  undefined1 local_26d0 [16];
  undefined1 *local_26c0 [2];
  undefined1 local_26b0 [16];
  undefined1 *local_26a0 [2];
  undefined1 local_2690 [16];
  undefined1 *local_2680 [2];
  undefined1 local_2670 [16];
  undefined1 *local_2660 [2];
  undefined1 local_2650 [16];
  undefined1 *local_2640 [2];
  undefined1 local_2630 [16];
  undefined1 *local_2620 [2];
  undefined1 local_2610 [16];
  undefined1 *local_2600 [2];
  undefined1 local_25f0 [16];
  undefined1 *local_25e0 [2];
  undefined1 local_25d0 [16];
  undefined1 *local_25c0 [2];
  undefined1 local_25b0 [16];
  undefined1 *local_25a0 [2];
  undefined1 local_2590 [16];
  undefined1 *local_2580 [2];
  undefined1 local_2570 [16];
  undefined1 *local_2560 [2];
  undefined1 local_2550 [16];
  undefined1 *local_2540 [2];
  undefined1 local_2530 [16];
  undefined1 *local_2520 [2];
  undefined1 local_2510 [16];
  undefined1 *local_2500 [2];
  undefined1 local_24f0 [16];
  undefined1 *local_24e0 [2];
  undefined1 local_24d0 [16];
  undefined1 *local_24c0 [2];
  undefined1 local_24b0 [16];
  undefined1 *local_24a0 [2];
  undefined1 local_2490 [16];
  undefined1 *local_2480 [2];
  undefined1 local_2470 [16];
  undefined1 *local_2460 [2];
  undefined1 local_2450 [16];
  undefined1 *local_2440 [2];
  undefined1 local_2430 [16];
  undefined1 *local_2420 [2];
  undefined1 local_2410 [16];
  undefined1 *local_2400 [2];
  undefined1 local_23f0 [16];
  undefined1 *local_23e0 [2];
  undefined1 local_23d0 [16];
  undefined1 *local_23c0 [2];
  undefined1 local_23b0 [16];
  undefined1 *local_23a0 [2];
  undefined1 local_2390 [16];
  undefined1 *local_2380 [2];
  undefined1 local_2370 [16];
  undefined1 *local_2360 [2];
  undefined1 local_2350 [16];
  undefined1 *local_2340 [2];
  undefined1 local_2330 [16];
  undefined1 *local_2320 [2];
  undefined1 local_2310 [16];
  undefined1 *local_2300 [2];
  undefined1 local_22f0 [16];
  undefined1 *local_22e0 [2];
  undefined1 local_22d0 [16];
  undefined1 *local_22c0 [2];
  undefined1 local_22b0 [16];
  undefined1 *local_22a0 [2];
  undefined1 local_2290 [16];
  undefined1 *local_2280 [2];
  undefined1 local_2270 [16];
  undefined1 *local_2260 [2];
  undefined1 local_2250 [16];
  undefined1 *local_2240 [2];
  undefined1 local_2230 [16];
  undefined1 *local_2220 [2];
  undefined1 local_2210 [16];
  undefined1 *local_2200 [2];
  undefined1 local_21f0 [16];
  undefined1 *local_21e0 [2];
  undefined1 local_21d0 [16];
  undefined1 *local_21c0 [2];
  undefined1 local_21b0 [16];
  undefined1 *local_21a0 [2];
  undefined1 local_2190 [16];
  undefined1 *local_2180 [2];
  undefined1 local_2170 [16];
  undefined1 *local_2160 [2];
  undefined1 local_2150 [16];
  undefined1 *local_2140 [2];
  undefined1 local_2130 [16];
  undefined1 *local_2120 [2];
  undefined1 local_2110 [16];
  undefined1 *local_2100 [2];
  undefined1 local_20f0 [16];
  undefined1 *local_20e0 [2];
  undefined1 local_20d0 [16];
  undefined1 *local_20c0 [2];
  undefined1 local_20b0 [16];
  undefined1 *local_20a0 [2];
  undefined1 local_2090 [16];
  undefined1 *local_2080 [2];
  undefined1 local_2070 [16];
  undefined1 *local_2060 [2];
  undefined1 local_2050 [16];
  undefined1 *local_2040 [2];
  undefined1 local_2030 [16];
  undefined1 *local_2020 [2];
  undefined1 local_2010 [16];
  undefined1 *local_2000 [2];
  undefined1 local_1ff0 [16];
  undefined1 *local_1fe0 [2];
  undefined1 local_1fd0 [16];
  undefined1 *local_1fc0 [2];
  undefined1 local_1fb0 [16];
  undefined1 *local_1fa0 [2];
  undefined1 local_1f90 [16];
  undefined1 *local_1f80 [2];
  undefined1 local_1f70 [16];
  undefined1 *local_1f60 [2];
  undefined1 local_1f50 [16];
  undefined1 *local_1f40 [2];
  undefined1 local_1f30 [16];
  undefined1 *local_1f20 [2];
  undefined1 local_1f10 [16];
  undefined1 *local_1f00 [2];
  undefined1 local_1ef0 [16];
  undefined1 *local_1ee0 [2];
  undefined1 local_1ed0 [16];
  undefined1 *local_1ec0 [2];
  undefined1 local_1eb0 [16];
  undefined1 *local_1ea0 [2];
  undefined1 local_1e90 [16];
  undefined1 *local_1e80 [2];
  undefined1 local_1e70 [16];
  undefined1 *local_1e60 [2];
  undefined1 local_1e50 [16];
  undefined1 *local_1e40 [2];
  undefined1 local_1e30 [16];
  undefined1 *local_1e20 [2];
  undefined1 local_1e10 [16];
  undefined1 *local_1e00 [2];
  undefined1 local_1df0 [16];
  undefined1 *local_1de0 [2];
  undefined1 local_1dd0 [16];
  undefined1 *local_1dc0 [2];
  undefined1 local_1db0 [16];
  undefined1 *local_1da0 [2];
  undefined1 local_1d90 [16];
  undefined1 *local_1d80 [2];
  undefined1 local_1d70 [16];
  undefined1 *local_1d60 [2];
  undefined1 local_1d50 [16];
  undefined1 *local_1d40 [2];
  undefined1 local_1d30 [16];
  undefined1 *local_1d20 [2];
  undefined1 local_1d10 [16];
  undefined1 *local_1d00 [2];
  undefined1 local_1cf0 [16];
  undefined1 *local_1ce0 [2];
  undefined1 local_1cd0 [16];
  undefined1 *local_1cc0 [2];
  undefined1 local_1cb0 [16];
  undefined1 *local_1ca0 [2];
  undefined1 local_1c90 [16];
  undefined1 *local_1c80 [2];
  undefined1 local_1c70 [16];
  undefined1 *local_1c60 [2];
  undefined1 local_1c50 [16];
  undefined1 *local_1c40 [2];
  undefined1 local_1c30 [16];
  undefined1 *local_1c20 [2];
  undefined1 local_1c10 [16];
  undefined1 *local_1c00 [2];
  undefined1 local_1bf0 [16];
  undefined1 *local_1be0 [2];
  undefined1 local_1bd0 [16];
  undefined1 *local_1bc0 [2];
  undefined1 local_1bb0 [16];
  undefined1 *local_1ba0 [2];
  undefined1 local_1b90 [16];
  undefined1 *local_1b80 [2];
  undefined1 local_1b70 [16];
  undefined1 *local_1b60 [2];
  undefined1 local_1b50 [16];
  undefined1 *local_1b40 [2];
  undefined1 local_1b30 [16];
  undefined1 *local_1b20 [2];
  undefined1 local_1b10 [16];
  undefined1 *local_1b00 [2];
  undefined1 local_1af0 [16];
  undefined1 *local_1ae0 [2];
  undefined1 local_1ad0 [16];
  undefined1 *local_1ac0 [2];
  undefined1 local_1ab0 [16];
  undefined1 *local_1aa0 [2];
  undefined1 local_1a90 [16];
  undefined1 *local_1a80 [2];
  undefined1 local_1a70 [16];
  undefined1 *local_1a60 [2];
  undefined1 local_1a50 [16];
  undefined1 *local_1a40 [2];
  undefined1 local_1a30 [16];
  undefined1 *local_1a20 [2];
  undefined1 local_1a10 [16];
  undefined1 *local_1a00 [2];
  undefined1 local_19f0 [16];
  undefined1 *local_19e0 [2];
  undefined1 local_19d0 [16];
  undefined1 *local_19c0 [2];
  undefined1 local_19b0 [16];
  undefined1 *local_19a0 [2];
  undefined1 local_1990 [16];
  undefined1 *local_1980 [2];
  undefined1 local_1970 [16];
  undefined1 *local_1960 [2];
  undefined1 local_1950 [16];
  undefined1 *local_1940 [2];
  undefined1 local_1930 [16];
  undefined1 *local_1920 [2];
  undefined1 local_1910 [16];
  undefined1 *local_1900 [2];
  undefined1 local_18f0 [16];
  undefined1 *local_18e0 [2];
  undefined1 local_18d0 [16];
  undefined1 *local_18c0 [2];
  undefined1 local_18b0 [16];
  undefined1 *local_18a0 [2];
  undefined1 local_1890 [16];
  undefined1 *local_1880 [2];
  undefined1 local_1870 [16];
  undefined1 *local_1860 [2];
  undefined1 local_1850 [16];
  undefined1 *local_1840 [2];
  undefined1 local_1830 [16];
  undefined1 *local_1820 [2];
  undefined1 local_1810 [16];
  undefined1 *local_1800 [2];
  undefined1 local_17f0 [16];
  undefined1 *local_17e0 [2];
  undefined1 local_17d0 [16];
  undefined1 *local_17c0 [2];
  undefined1 local_17b0 [16];
  undefined1 *local_17a0 [2];
  undefined1 local_1790 [16];
  undefined1 *local_1780 [2];
  undefined1 local_1770 [16];
  undefined1 *local_1760 [2];
  undefined1 local_1750 [16];
  undefined1 *local_1740 [2];
  undefined1 local_1730 [16];
  undefined1 *local_1720 [2];
  undefined1 local_1710 [16];
  undefined1 *local_1700 [2];
  undefined1 local_16f0 [16];
  undefined1 *local_16e0 [2];
  undefined1 local_16d0 [16];
  undefined1 *local_16c0 [2];
  undefined1 local_16b0 [16];
  undefined1 *local_16a0 [2];
  undefined1 local_1690 [16];
  undefined1 *local_1680 [2];
  undefined1 local_1670 [16];
  undefined1 *local_1660 [2];
  undefined1 local_1650 [16];
  undefined1 *local_1640 [2];
  undefined1 local_1630 [16];
  undefined1 *local_1620 [2];
  undefined1 local_1610 [16];
  undefined1 *local_1600 [2];
  undefined1 local_15f0 [16];
  undefined1 *local_15e0 [2];
  undefined1 local_15d0 [16];
  undefined1 *local_15c0 [2];
  undefined1 local_15b0 [16];
  undefined1 *local_15a0 [2];
  undefined1 local_1590 [16];
  undefined1 *local_1580 [2];
  undefined1 local_1570 [16];
  undefined1 *local_1560 [2];
  undefined1 local_1550 [16];
  undefined1 *local_1540 [2];
  undefined1 local_1530 [16];
  undefined1 *local_1520 [2];
  undefined1 local_1510 [16];
  undefined1 *local_1500 [2];
  undefined1 local_14f0 [16];
  undefined1 *local_14e0 [2];
  undefined1 local_14d0 [16];
  undefined1 *local_14c0 [2];
  undefined1 local_14b0 [16];
  undefined1 *local_14a0 [2];
  undefined1 local_1490 [16];
  undefined1 *local_1480 [2];
  undefined1 local_1470 [16];
  undefined1 *local_1460 [2];
  undefined1 local_1450 [16];
  undefined1 *local_1440 [2];
  undefined1 local_1430 [16];
  undefined1 *local_1420 [2];
  undefined1 local_1410 [16];
  undefined1 *local_1400 [2];
  undefined1 local_13f0 [16];
  undefined1 *local_13e0 [2];
  undefined1 local_13d0 [16];
  undefined1 *local_13c0 [2];
  undefined1 local_13b0 [16];
  undefined1 *local_13a0 [2];
  undefined1 local_1390 [16];
  undefined1 *local_1380 [2];
  undefined1 local_1370 [16];
  undefined1 *local_1360 [2];
  undefined1 local_1350 [16];
  undefined1 *local_1340 [2];
  undefined1 local_1330 [16];
  undefined1 *local_1320 [2];
  undefined1 local_1310 [16];
  undefined1 *local_1300 [2];
  undefined1 local_12f0 [16];
  undefined1 *local_12e0 [2];
  undefined1 local_12d0 [16];
  undefined1 *local_12c0 [2];
  undefined1 local_12b0 [16];
  undefined1 *local_12a0 [2];
  undefined1 local_1290 [16];
  undefined1 *local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 *local_1260 [2];
  undefined1 local_1250 [16];
  undefined1 *local_1240 [2];
  undefined1 local_1230 [16];
  undefined1 *local_1220 [2];
  undefined1 local_1210 [16];
  undefined1 *local_1200 [2];
  undefined1 local_11f0 [16];
  undefined1 *local_11e0 [2];
  undefined1 local_11d0 [16];
  undefined1 *local_11c0 [2];
  undefined1 local_11b0 [16];
  undefined1 *local_11a0 [2];
  undefined1 local_1190 [16];
  undefined1 *local_1180 [2];
  undefined1 local_1170 [16];
  undefined1 *local_1160 [2];
  undefined1 local_1150 [16];
  undefined1 *local_1140 [2];
  undefined1 local_1130 [16];
  undefined1 *local_1120 [2];
  undefined1 local_1110 [16];
  undefined1 *local_1100 [2];
  undefined1 local_10f0 [16];
  undefined1 *local_10e0 [2];
  undefined1 local_10d0 [16];
  undefined1 *local_10c0 [2];
  undefined1 local_10b0 [16];
  undefined1 *local_10a0 [2];
  undefined1 local_1090 [16];
  undefined1 *local_1080 [2];
  undefined1 local_1070 [16];
  undefined1 *local_1060 [2];
  undefined1 local_1050 [16];
  undefined1 *local_1040 [2];
  undefined1 local_1030 [16];
  undefined1 *local_1020 [2];
  undefined1 local_1010 [16];
  undefined1 *local_1000 [2];
  undefined1 local_ff0 [16];
  undefined1 *local_fe0 [2];
  undefined1 local_fd0 [16];
  undefined1 *local_fc0 [2];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0 [2];
  undefined1 local_f90 [16];
  undefined1 *local_f80 [2];
  undefined1 local_f70 [16];
  undefined1 *local_f60 [2];
  undefined1 local_f50 [16];
  undefined1 *local_f40 [2];
  undefined1 local_f30 [16];
  undefined1 *local_f20 [2];
  undefined1 local_f10 [16];
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [16];
  undefined1 *local_ee0 [2];
  undefined1 local_ed0 [16];
  undefined1 *local_ec0 [2];
  undefined1 local_eb0 [16];
  undefined1 *local_ea0 [2];
  undefined1 local_e90 [16];
  undefined1 *local_e80 [2];
  undefined1 local_e70 [16];
  undefined1 *local_e60 [2];
  undefined1 local_e50 [16];
  undefined1 *local_e40 [2];
  undefined1 local_e30 [16];
  undefined1 *local_e20 [2];
  undefined1 local_e10 [16];
  undefined1 *local_e00 [2];
  undefined1 local_df0 [16];
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [16];
  undefined1 *local_dc0 [2];
  undefined1 local_db0 [16];
  undefined1 *local_da0 [2];
  undefined1 local_d90 [16];
  undefined1 *local_d80 [2];
  undefined1 local_d70 [16];
  undefined1 *local_d60 [2];
  undefined1 local_d50 [16];
  undefined1 *local_d40 [2];
  undefined1 local_d30 [16];
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  undefined1 *local_cc0 [2];
  undefined1 local_cb0 [16];
  undefined1 *local_ca0 [2];
  undefined1 local_c90 [16];
  undefined1 *local_c80 [2];
  undefined1 local_c70 [16];
  undefined1 *local_c60 [2];
  undefined1 local_c50 [16];
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined1 *local_c20 [2];
  undefined1 local_c10 [16];
  undefined1 *local_c00 [2];
  undefined1 local_bf0 [16];
  undefined1 *local_be0 [2];
  undefined1 local_bd0 [16];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [16];
  undefined1 *local_ba0 [2];
  undefined1 local_b90 [16];
  undefined1 *local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 *local_b60 [2];
  undefined1 local_b50 [16];
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined1 *local_aa0 [2];
  undefined1 local_a90 [16];
  undefined1 *local_a80 [2];
  undefined1 local_a70 [16];
  undefined1 *local_a60 [2];
  undefined1 local_a50 [16];
  undefined1 *local_a40 [2];
  undefined1 local_a30 [16];
  undefined1 *local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 *local_a00 [2];
  undefined1 local_9f0 [16];
  undefined1 *local_9e0 [2];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0 [2];
  undefined1 local_9b0 [16];
  undefined1 *local_9a0 [2];
  undefined1 local_990 [16];
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined1 *local_940 [2];
  undefined1 local_930 [16];
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_2ea0[0] = local_2e90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ea0,"abs","");
      local_2e80[0] = local_2e70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e80,"acos","");
      local_2e60[0] = local_2e50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e60,"acosh","");
      local_2e40[0] = local_2e30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e40,"all","");
      local_2e20[0] = local_2e10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e20,"any","");
      local_2e00[0] = local_2df0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e00,"asin","");
      local_2de0[0] = local_2dd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2de0,"asinh","");
      local_2dc0[0] = local_2db0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2dc0,"atan","");
      local_2da0[0] = local_2d90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2da0,"atanh","");
      local_2d80[0] = local_2d70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d80,"atomicAdd","");
      local_2d60[0] = local_2d50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d60,"atomicCompSwap","");
      local_2d40[0] = local_2d30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d40,"atomicCounter","");
      local_2d20[0] = local_2d10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d20,"atomicCounterDecrement","");
      local_2d00[0] = local_2cf0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d00,"atomicCounterIncrement","");
      local_2ce0[0] = local_2cd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ce0,"atomicExchange","");
      local_2cc0[0] = local_2cb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2cc0,"atomicMax","");
      local_2ca0[0] = local_2c90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ca0,"atomicMin","");
      local_2c80[0] = local_2c70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c80,"atomicOr","");
      local_2c60[0] = local_2c50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c60,"atomicXor","");
      local_2c40[0] = local_2c30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c40,"bitCount","");
      local_2c20[0] = local_2c10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c20,"bitfieldExtract","");
      local_2c00[0] = local_2bf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c00,"bitfieldInsert","");
      local_2be0[0] = local_2bd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2be0,"bitfieldReverse","");
      local_2bc0[0] = local_2bb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2bc0,"ceil","");
      local_2ba0[0] = local_2b90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ba0,"cos","");
      local_2b80[0] = local_2b70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b80,"cosh","");
      local_2b60[0] = local_2b50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b60,"cross","");
      local_2b40[0] = local_2b30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b40,"degrees","");
      local_2b20[0] = local_2b10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b20,"dFdx","");
      local_2b00[0] = local_2af0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b00,"dFdxCoarse","");
      local_2ae0[0] = local_2ad0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ae0,"dFdxFine","");
      local_2ac0[0] = local_2ab0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2ac0,"dFdy","");
      local_2aa0[0] = local_2a90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2aa0,"dFdyCoarse","");
      local_2a80[0] = local_2a70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a80,"dFdyFine","");
      local_2a60[0] = local_2a50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a60,"distance","");
      local_2a40[0] = local_2a30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a40,"dot","");
      local_2a20[0] = local_2a10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a20,"EmitStreamVertex","");
      local_2a00[0] = local_29f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a00,"EmitVertex","");
      local_29e0[0] = local_29d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_29e0,"EndPrimitive","");
      local_29c0[0] = local_29b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_29c0,"EndStreamPrimitive","");
      local_29a0[0] = local_2990;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_29a0,"equal","");
      local_2980[0] = local_2970;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2980,"exp","");
      local_2960[0] = local_2950;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2960,"exp2","");
      local_2940[0] = local_2930;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2940,"faceforward","");
      local_2920[0] = local_2910;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2920,"findLSB","");
      local_2900[0] = local_28f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2900,"findMSB","");
      local_28e0[0] = local_28d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_28e0,"float16BitsToInt16","");
      local_28c0[0] = local_28b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_28c0,"float16BitsToUint16","");
      local_28a0[0] = local_2890;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_28a0,"floatBitsToInt","");
      local_2880[0] = local_2870;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2880,"floatBitsToUint","");
      local_2860[0] = local_2850;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2860,"floor","");
      local_2840[0] = local_2830;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2840,"fma","");
      local_2820[0] = local_2810;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2820,"fract","");
      local_2800[0] = local_27f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2800,"frexp","");
      local_27e0[0] = local_27d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27e0,"fwidth","");
      local_27c0[0] = local_27b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27c0,"fwidthCoarse","");
      local_27a0[0] = local_2790;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_27a0,"fwidthFine","");
      local_2780[0] = local_2770;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2780,"greaterThan","");
      local_2760[0] = local_2750;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2760,"greaterThanEqual","");
      local_2740[0] = local_2730;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2740,"groupMemoryBarrier","");
      local_2720[0] = local_2710;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2720,"imageAtomicAdd","");
      local_2700[0] = local_26f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2700,"imageAtomicAnd","");
      local_26e0[0] = local_26d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_26e0,"imageAtomicCompSwap","");
      local_26c0[0] = local_26b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_26c0,"imageAtomicExchange","");
      local_26a0[0] = local_2690;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_26a0,"imageAtomicMax","");
      local_2680[0] = local_2670;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2680,"imageAtomicMin","");
      local_2660[0] = local_2650;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2660,"imageAtomicOr","");
      local_2640[0] = local_2630;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2640,"imageAtomicXor","");
      local_2620[0] = local_2610;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2620,"imageLoad","");
      local_2600[0] = local_25f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2600,"imageSamples","");
      local_25e0[0] = local_25d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25e0,"imageSize","");
      local_25c0[0] = local_25b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25c0,"imageStore","");
      local_25a0[0] = local_2590;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_25a0,"imulExtended","");
      local_2580[0] = local_2570;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2580,"int16BitsToFloat16","");
      local_2560[0] = local_2550;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2560,"intBitsToFloat","");
      local_2540[0] = local_2530;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2540,"interpolateAtOffset","");
      local_2520[0] = local_2510;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2520,"interpolateAtCentroid","");
      local_2500[0] = local_24f0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2500,"interpolateAtSample","");
      local_24e0[0] = local_24d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24e0,"inverse","");
      local_24c0[0] = local_24b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24c0,"inversesqrt","");
      local_24a0[0] = local_2490;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_24a0,"isinf","");
      local_2480[0] = local_2470;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2480,"isnan","");
      local_2460[0] = local_2450;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2460,"ldexp","");
      local_2440[0] = local_2430;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2440,"length","");
      local_2420[0] = local_2410;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2420,"lessThan","");
      local_2400[0] = local_23f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2400,"lessThanEqual","");
      local_23e0[0] = local_23d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23e0,"log","");
      local_23c0[0] = local_23b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23c0,"log2","");
      local_23a0[0] = local_2390;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_23a0,"matrixCompMult","");
      local_2380[0] = local_2370;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2380,"max","");
      local_2360[0] = local_2350;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2360,"memoryBarrier","");
      local_2340[0] = local_2330;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2340,"memoryBarrierAtomicCounter","");
      local_2320[0] = local_2310;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2320,"memoryBarrierBuffer","");
      local_2300[0] = local_22f0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2300,"memoryBarrierImage","");
      local_22e0[0] = local_22d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_22e0,"memoryBarrierShared","");
      local_22c0[0] = local_22b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_22c0,"min","");
      local_22a0[0] = local_2290;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_22a0,"mix","");
      local_2280[0] = local_2270;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2280,"mod","");
      local_2260[0] = local_2250;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2260,"modf","");
      local_2240[0] = local_2230;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2240,"noise","");
      local_2220[0] = local_2210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2220,"noise1","");
      local_2200[0] = local_21f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2200,"noise2","");
      local_21e0[0] = local_21d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21e0,"noise3","");
      local_21c0[0] = local_21b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21c0,"noise4","");
      local_21a0[0] = local_2190;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_21a0,"normalize","");
      local_2180[0] = local_2170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2180,"not","");
      local_2160[0] = local_2150;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2160,"notEqual","");
      local_2140[0] = local_2130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2140,"outerProduct","");
      local_2120[0] = local_2110;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2120,"packDouble2x32","");
      local_2100[0] = local_20f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2100,"packHalf2x16","");
      local_20e0[0] = local_20d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20e0,"packInt2x16","");
      local_20c0[0] = local_20b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20c0,"packInt4x16","");
      local_20a0[0] = local_2090;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_20a0,"packSnorm2x16","");
      local_2080[0] = local_2070;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2080,"packSnorm4x8","");
      local_2060[0] = local_2050;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2060,"packUint2x16","");
      local_2040[0] = local_2030;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2040,"packUint4x16","");
      local_2020[0] = local_2010;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2020,"packUnorm2x16","");
      local_2000[0] = local_1ff0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2000,"packUnorm4x8","");
      local_1fe0[0] = local_1fd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fe0,"pow","");
      local_1fc0[0] = local_1fb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fc0,"radians","");
      local_1fa0[0] = local_1f90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa0,"reflect","");
      local_1f80[0] = local_1f70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f80,"refract","");
      local_1f60[0] = local_1f50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f60,"round","");
      local_1f40[0] = local_1f30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f40,"roundEven","");
      local_1f20[0] = local_1f10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f20,"sign","");
      local_1f00[0] = local_1ef0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f00,"sin","");
      local_1ee0[0] = local_1ed0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ee0,"sinh","");
      local_1ec0[0] = local_1eb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ec0,"smoothstep","");
      local_1ea0[0] = local_1e90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ea0,"sqrt","");
      local_1e80[0] = local_1e70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e80,"step","");
      local_1e60[0] = local_1e50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e60,"tan","");
      local_1e40[0] = local_1e30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e40,"tanh","");
      local_1e20[0] = local_1e10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e20,"texelFetch","");
      local_1e00[0] = local_1df0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e00,"texelFetchOffset","");
      local_1de0[0] = local_1dd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1de0,"texture","");
      local_1dc0[0] = local_1db0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1dc0,"textureGather","");
      local_1da0[0] = local_1d90;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1da0,"textureGatherOffset","");
      local_1d80[0] = local_1d70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d80,"textureGatherOffsets","");
      local_1d60[0] = local_1d50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d60,"textureGrad","");
      local_1d40[0] = local_1d30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d40,"textureGradOffset","")
      ;
      local_1d20[0] = local_1d10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d20,"textureLod","");
      local_1d00[0] = local_1cf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d00,"textureLodOffset","");
      local_1ce0[0] = local_1cd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ce0,"textureOffset","");
      local_1cc0[0] = local_1cb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1cc0,"textureProj","");
      local_1ca0[0] = local_1c90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ca0,"textureProjGrad","");
      local_1c80[0] = local_1c70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c80,"textureProjGradOffset","");
      local_1c60[0] = local_1c50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c60,"textureProjLod","");
      local_1c40[0] = local_1c30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c40,"textureProjLodOffset","");
      local_1c20[0] = local_1c10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c20,"textureProjOffset","")
      ;
      local_1c00[0] = local_1bf0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c00,"textureQueryLevels","");
      local_1be0[0] = local_1bd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1be0,"textureQueryLod","");
      local_1bc0[0] = local_1bb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1bc0,"textureSamples","");
      local_1ba0[0] = local_1b90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ba0,"textureSize","");
      local_1b80[0] = local_1b70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b80,"transpose","");
      local_1b60[0] = local_1b50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b60,"trunc","");
      local_1b40[0] = local_1b30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"uaddCarry","");
      local_1b20[0] = local_1b10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b20,"uint16BitsToFloat16","");
      local_1b00[0] = local_1af0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b00,"uintBitsToFloat","");
      local_1ae0[0] = local_1ad0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ae0,"umulExtended","");
      local_1ac0[0] = local_1ab0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1ac0,"unpackDouble2x32","");
      local_1aa0[0] = local_1a90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1aa0,"unpackHalf2x16","");
      local_1a80[0] = local_1a70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a80,"unpackInt2x16","");
      local_1a60[0] = local_1a50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a60,"unpackInt4x16","");
      local_1a40[0] = local_1a30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a40,"unpackSnorm2x16","");
      local_1a20[0] = local_1a10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a20,"unpackSnorm4x8","");
      local_1a00[0] = local_19f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a00,"unpackUint2x16","");
      local_19e0[0] = local_19d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19e0,"unpackUint4x16","");
      local_19c0[0] = local_19b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19c0,"unpackUnorm2x16","");
      local_19a0[0] = local_1990;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_19a0,"unpackUnorm4x8","");
      local_1980[0] = local_1970;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1980,"usubBorrow","");
      local_1960[0] = local_1950;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1960,"active","");
      local_1940[0] = local_1930;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1940,"asm","");
      local_1920[0] = local_1910;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1920,"atomic_uint","");
      local_1900[0] = local_18f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1900,"attribute","");
      local_18e0[0] = local_18d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18e0,"bool","");
      local_18c0[0] = local_18b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18c0,"break","");
      local_18a0[0] = local_1890;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_18a0,"buffer","");
      local_1880[0] = local_1870;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1880,"bvec2","");
      local_1860[0] = local_1850;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1860,"bvec3","");
      local_1840[0] = local_1830;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1840,"bvec4","");
      local_1820[0] = local_1810;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1820,"case","");
      local_1800[0] = local_17f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1800,"cast","");
      local_17e0[0] = local_17d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17e0,"centroid","");
      local_17c0[0] = local_17b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17c0,"class","");
      local_17a0[0] = local_1790;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_17a0,"coherent","");
      local_1780[0] = local_1770;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1780,"common","");
      local_1760[0] = local_1750;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1760,"const","");
      local_1740[0] = local_1730;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1740,"continue","");
      local_1720[0] = local_1710;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1720,"default","");
      local_1700[0] = local_16f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1700,"discard","");
      local_16e0[0] = local_16d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16e0,"dmat2","");
      local_16c0[0] = local_16b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16c0,"dmat2x2","");
      local_16a0[0] = local_1690;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_16a0,"dmat2x3","");
      local_1680[0] = local_1670;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1680,"dmat2x4","");
      local_1660[0] = local_1650;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1660,"dmat3","");
      local_1640[0] = local_1630;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1640,"dmat3x2","");
      local_1620[0] = local_1610;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1620,"dmat3x3","");
      local_1600[0] = local_15f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1600,"dmat3x4","");
      local_15e0[0] = local_15d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15e0,"dmat4","");
      local_15c0[0] = local_15b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15c0,"dmat4x2","");
      local_15a0[0] = local_1590;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_15a0,"dmat4x3","");
      local_1580[0] = local_1570;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1580,"dmat4x4","");
      local_1560[0] = local_1550;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1560,"do","");
      local_1540[0] = local_1530;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1540,"double","");
      local_1520[0] = local_1510;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1520,"dvec2","");
      local_1500[0] = local_14f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1500,"dvec3","");
      local_14e0[0] = local_14d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14e0,"dvec4","");
      local_14c0[0] = local_14b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14c0,"else","");
      local_14a0[0] = local_1490;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_14a0,"enum","");
      local_1480[0] = local_1470;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1480,"extern","");
      local_1460[0] = local_1450;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1460,"external","");
      local_1440[0] = local_1430;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1440,"false","");
      local_1420[0] = local_1410;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1420,"filter","");
      local_1400[0] = local_13f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1400,"fixed","");
      local_13e0[0] = local_13d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13e0,"flat","");
      local_13c0[0] = local_13b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13c0,"float","");
      local_13a0[0] = local_1390;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_13a0,"for","");
      local_1380[0] = local_1370;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1380,"fvec2","");
      local_1360[0] = local_1350;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1360,"fvec3","");
      local_1340[0] = local_1330;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1340,"fvec4","");
      local_1320[0] = local_1310;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1320,"goto","");
      local_1300[0] = local_12f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1300,"half","");
      local_12e0[0] = local_12d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12e0,"highp","");
      local_12c0[0] = local_12b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12c0,"hvec2","");
      local_12a0[0] = local_1290;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_12a0,"hvec3","");
      local_1280[0] = local_1270;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1280,"hvec4","");
      local_1260[0] = local_1250;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1260,"if","");
      local_1240[0] = local_1230;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1240,"iimage1D","");
      local_1220[0] = local_1210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1220,"iimage1DArray","");
      local_1200[0] = local_11f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1200,"iimage2D","");
      local_11e0[0] = local_11d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11e0,"iimage2DArray","");
      local_11c0[0] = local_11b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11c0,"iimage2DMS","");
      local_11a0[0] = local_1190;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_11a0,"iimage2DMSArray","");
      local_1180[0] = local_1170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1180,"iimage2DRect","");
      local_1160[0] = local_1150;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1160,"iimage3D","");
      local_1140[0] = local_1130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1140,"iimageBuffer","");
      local_1120[0] = local_1110;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1120,"iimageCube","");
      local_1100[0] = local_10f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1100,"iimageCubeArray","");
      local_10e0[0] = local_10d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10e0,"image1D","");
      local_10c0[0] = local_10b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10c0,"image1DArray","");
      local_10a0[0] = local_1090;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10a0,"image2D","");
      local_1080[0] = local_1070;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1080,"image2DArray","");
      local_1060[0] = local_1050;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1060,"image2DMS","");
      local_1040[0] = local_1030;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1040,"image2DMSArray","");
      local_1020[0] = local_1010;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"image2DRect","");
      local_1000[0] = local_ff0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1000,"image3D","");
      local_fe0[0] = local_fd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"imageBuffer","");
      local_fc0[0] = local_fb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fc0,"imageCube","");
      local_fa0[0] = local_f90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"imageCubeArray","");
      local_f80[0] = local_f70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f80,"in","");
      local_f60[0] = local_f50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"inline","");
      local_f40[0] = local_f30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f40,"inout","");
      local_f20[0] = local_f10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f20,"input","");
      local_f00[0] = local_ef0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"int","");
      local_ee0[0] = local_ed0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ee0,"interface","");
      local_ec0[0] = local_eb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ec0,"invariant","");
      local_ea0[0] = local_e90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ea0,"isampler1D","");
      local_e80[0] = local_e70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e80,"isampler1DArray","");
      local_e60[0] = local_e50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e60,"isampler2D","");
      local_e40[0] = local_e30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e40,"isampler2DArray","");
      local_e20[0] = local_e10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e20,"isampler2DMS","");
      local_e00[0] = local_df0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"isampler2DMSArray","");
      local_de0[0] = local_dd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de0,"isampler2DRect","");
      local_dc0[0] = local_db0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc0,"isampler3D","");
      local_da0[0] = local_d90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_da0,"isamplerBuffer","");
      local_d80[0] = local_d70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d80,"isamplerCube","");
      local_d60[0] = local_d50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d60,"isamplerCubeArray","");
      local_d40[0] = local_d30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"ivec2","");
      local_d20[0] = local_d10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"ivec3","");
      local_d00[0] = local_cf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"ivec4","");
      local_ce0[0] = local_cd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce0,"layout","");
      local_cc0[0] = local_cb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"long","");
      local_ca0[0] = local_c90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca0,"lowp","");
      local_c80[0] = local_c70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c80,"mat2","");
      local_c60[0] = local_c50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c60,"mat2x2","");
      local_c40[0] = local_c30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c40,"mat2x3","");
      local_c20[0] = local_c10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c20,"mat2x4","");
      local_c00[0] = local_bf0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"mat3","");
      local_be0[0] = local_bd0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_be0,"mat3x2","");
      local_bc0[0] = local_bb0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_bc0,"mat3x3","");
      local_ba0[0] = local_b90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ba0,"mat3x4","");
      local_b80[0] = local_b70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b80,"mat4","");
      local_b60[0] = local_b50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"mat4x2","");
      local_b40[0] = local_b30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"mat4x3","");
      local_b20[0] = local_b10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"mat4x4","");
      local_b00[0] = local_af0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"mediump","");
      local_ae0[0] = local_ad0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"namespace","");
      local_ac0[0] = local_ab0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"noinline","");
      local_aa0[0] = local_a90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"noperspective","");
      local_a80[0] = local_a70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"out","");
      local_a60[0] = local_a50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"output","");
      local_a40[0] = local_a30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"packed","");
      local_a20[0] = local_a10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"partition","");
      local_a00[0] = local_9f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a00,"patch","");
      local_9e0[0] = local_9d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e0,"precise","");
      local_9c0[0] = local_9b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c0,"precision","");
      local_9a0[0] = local_990;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a0,"public","");
      local_980[0] = local_970;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"readonly","");
      local_960[0] = local_950;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"resource","");
      local_940[0] = local_930;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"restrict","");
      local_920[0] = local_910;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"return","");
      local_900[0] = local_8f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"sample","");
      local_8e0[0] = local_8d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e0,"sampler1D","");
      local_8c0[0] = local_8b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"sampler1DArray","");
      local_8a0[0] = local_890;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8a0,"sampler1DArrayShadow","");
      local_880[0] = local_870;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"sampler1DShadow","");
      local_860[0] = local_850;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_860,"sampler2D","");
      local_840[0] = local_830;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"sampler2DArray","");
      local_820[0] = local_810;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_820,"sampler2DArrayShadow","");
      local_800[0] = local_7f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"sampler2DMS","");
      local_7e0[0] = local_7d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"sampler2DMSArray","");
      local_7c0[0] = local_7b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"sampler2DRect","");
      local_7a0[0] = local_790;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7a0,"sampler2DRectShadow","");
      local_780[0] = local_770;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"sampler2DShadow","");
      local_760[0] = local_750;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"sampler3D","");
      local_740[0] = local_730;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"sampler3DRect","");
      local_720[0] = local_710;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"samplerBuffer","");
      local_700[0] = local_6f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"samplerCube","");
      local_6e0[0] = local_6d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"samplerCubeArray","");
      local_6c0[0] = local_6b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6c0,"samplerCubeArrayShadow","");
      local_6a0[0] = local_690;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"samplerCubeShadow","");
      local_680[0] = local_670;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"shared","");
      local_660[0] = local_650;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"short","");
      local_640[0] = local_630;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"sizeof","");
      local_620[0] = local_610;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"smooth","");
      local_600[0] = local_5f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"static","");
      local_5e0[0] = local_5d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"struct","");
      local_5c0[0] = local_5b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"subroutine","");
      local_5a0[0] = local_590;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"superp","");
      local_580[0] = local_570;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"switch","");
      local_560[0] = local_550;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"template","");
      local_540[0] = local_530;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"this","");
      local_520[0] = local_510;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"true","");
      local_500[0] = local_4f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"typedef","");
      local_4e0[0] = local_4d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"uimage1D","");
      local_4c0[0] = local_4b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"uimage1DArray","");
      local_4a0[0] = local_490;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"uimage2D","");
      local_480[0] = local_470;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"uimage2DArray","");
      local_460[0] = local_450;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"uimage2DMS","");
      local_440[0] = local_430;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"uimage2DMSArray","");
      local_420[0] = local_410;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"uimage2DRect","");
      local_400[0] = local_3f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"uimage3D","");
      local_3e0[0] = local_3d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"uimageBuffer","");
      local_3c0[0] = local_3b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"uimageCube","");
      local_3a0[0] = local_390;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"uimageCubeArray","");
      local_380[0] = local_370;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"uint","");
      local_360[0] = local_350;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"uniform","");
      local_340[0] = local_330;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"union","");
      local_320[0] = local_310;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"unsigned","");
      local_300[0] = local_2f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"usampler1D","");
      local_2e0[0] = local_2d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"usampler1DArray","");
      local_2c0[0] = local_2b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"usampler2D","");
      local_2a0[0] = local_290;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"usampler2DArray","");
      local_280[0] = local_270;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"usampler2DMS","");
      local_260[0] = local_250;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"usampler2DMSArray","");
      local_240[0] = local_230;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"usampler2DRect","");
      local_220[0] = local_210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"usampler3D","");
      local_200[0] = local_1f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"usamplerBuffer","");
      local_1e0[0] = local_1d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"usamplerCube","");
      local_1c0[0] = local_1b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"usamplerCubeArray","");
      local_1a0[0] = local_190;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"using","");
      local_180[0] = local_170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"uvec2","");
      local_160[0] = local_150;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"uvec3","");
      local_140[0] = local_130;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"uvec4","");
      local_120[0] = local_110;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"varying","");
      local_100[0] = local_f0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"vec2","");
      local_e0[0] = local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"vec3","");
      local_c0[0] = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"vec4","");
      local_a0[0] = local_90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"void","");
      local_80[0] = local_70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"volatile","");
      local_60[0] = local_50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"while","");
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"writeonly","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_2ea0,
                 &stack0xffffffffffffffe0,0,&local_2ea1,&local_2ea2,&local_2ea3);
      lVar2 = 0;
      do {
        if (local_30 + lVar2 != *(undefined1 **)((long)local_40 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x2e80);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  replace_illegal_names(this,&replace_illegal_names()::keywords_abi_cxx11_);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names()
{
	// clang-format off
	static const unordered_set<string> keywords = {
		"abs", "acos", "acosh", "all", "any", "asin", "asinh", "atan", "atanh",
		"atomicAdd", "atomicCompSwap", "atomicCounter", "atomicCounterDecrement", "atomicCounterIncrement",
		"atomicExchange", "atomicMax", "atomicMin", "atomicOr", "atomicXor",
		"bitCount", "bitfieldExtract", "bitfieldInsert", "bitfieldReverse",
		"ceil", "cos", "cosh", "cross", "degrees",
		"dFdx", "dFdxCoarse", "dFdxFine",
		"dFdy", "dFdyCoarse", "dFdyFine",
		"distance", "dot", "EmitStreamVertex", "EmitVertex", "EndPrimitive", "EndStreamPrimitive", "equal", "exp", "exp2",
		"faceforward", "findLSB", "findMSB", "float16BitsToInt16", "float16BitsToUint16", "floatBitsToInt", "floatBitsToUint", "floor", "fma", "fract",
		"frexp", "fwidth", "fwidthCoarse", "fwidthFine",
		"greaterThan", "greaterThanEqual", "groupMemoryBarrier",
		"imageAtomicAdd", "imageAtomicAnd", "imageAtomicCompSwap", "imageAtomicExchange", "imageAtomicMax", "imageAtomicMin", "imageAtomicOr", "imageAtomicXor",
		"imageLoad", "imageSamples", "imageSize", "imageStore", "imulExtended", "int16BitsToFloat16", "intBitsToFloat", "interpolateAtOffset", "interpolateAtCentroid", "interpolateAtSample",
		"inverse", "inversesqrt", "isinf", "isnan", "ldexp", "length", "lessThan", "lessThanEqual", "log", "log2",
		"matrixCompMult", "max", "memoryBarrier", "memoryBarrierAtomicCounter", "memoryBarrierBuffer", "memoryBarrierImage", "memoryBarrierShared",
		"min", "mix", "mod", "modf", "noise", "noise1", "noise2", "noise3", "noise4", "normalize", "not", "notEqual",
		"outerProduct", "packDouble2x32", "packHalf2x16", "packInt2x16", "packInt4x16", "packSnorm2x16", "packSnorm4x8",
		"packUint2x16", "packUint4x16", "packUnorm2x16", "packUnorm4x8", "pow",
		"radians", "reflect", "refract", "round", "roundEven", "sign", "sin", "sinh", "smoothstep", "sqrt", "step",
		"tan", "tanh", "texelFetch", "texelFetchOffset", "texture", "textureGather", "textureGatherOffset", "textureGatherOffsets",
		"textureGrad", "textureGradOffset", "textureLod", "textureLodOffset", "textureOffset", "textureProj", "textureProjGrad",
		"textureProjGradOffset", "textureProjLod", "textureProjLodOffset", "textureProjOffset", "textureQueryLevels", "textureQueryLod", "textureSamples", "textureSize",
		"transpose", "trunc", "uaddCarry", "uint16BitsToFloat16", "uintBitsToFloat", "umulExtended", "unpackDouble2x32", "unpackHalf2x16", "unpackInt2x16", "unpackInt4x16",
		"unpackSnorm2x16", "unpackSnorm4x8", "unpackUint2x16", "unpackUint4x16", "unpackUnorm2x16", "unpackUnorm4x8", "usubBorrow",

		"active", "asm", "atomic_uint", "attribute", "bool", "break", "buffer",
		"bvec2", "bvec3", "bvec4", "case", "cast", "centroid", "class", "coherent", "common", "const", "continue", "default", "discard",
		"dmat2", "dmat2x2", "dmat2x3", "dmat2x4", "dmat3", "dmat3x2", "dmat3x3", "dmat3x4", "dmat4", "dmat4x2", "dmat4x3", "dmat4x4",
		"do", "double", "dvec2", "dvec3", "dvec4", "else", "enum", "extern", "external", "false", "filter", "fixed", "flat", "float",
		"for", "fvec2", "fvec3", "fvec4", "goto", "half", "highp", "hvec2", "hvec3", "hvec4", "if", "iimage1D", "iimage1DArray",
		"iimage2D", "iimage2DArray", "iimage2DMS", "iimage2DMSArray", "iimage2DRect", "iimage3D", "iimageBuffer", "iimageCube",
		"iimageCubeArray", "image1D", "image1DArray", "image2D", "image2DArray", "image2DMS", "image2DMSArray", "image2DRect",
		"image3D", "imageBuffer", "imageCube", "imageCubeArray", "in", "inline", "inout", "input", "int", "interface", "invariant",
		"isampler1D", "isampler1DArray", "isampler2D", "isampler2DArray", "isampler2DMS", "isampler2DMSArray", "isampler2DRect",
		"isampler3D", "isamplerBuffer", "isamplerCube", "isamplerCubeArray", "ivec2", "ivec3", "ivec4", "layout", "long", "lowp",
		"mat2", "mat2x2", "mat2x3", "mat2x4", "mat3", "mat3x2", "mat3x3", "mat3x4", "mat4", "mat4x2", "mat4x3", "mat4x4", "mediump",
		"namespace", "noinline", "noperspective", "out", "output", "packed", "partition", "patch", "precise", "precision", "public", "readonly",
		"resource", "restrict", "return", "sample", "sampler1D", "sampler1DArray", "sampler1DArrayShadow",
		"sampler1DShadow", "sampler2D", "sampler2DArray", "sampler2DArrayShadow", "sampler2DMS", "sampler2DMSArray",
		"sampler2DRect", "sampler2DRectShadow", "sampler2DShadow", "sampler3D", "sampler3DRect", "samplerBuffer",
		"samplerCube", "samplerCubeArray", "samplerCubeArrayShadow", "samplerCubeShadow", "shared", "short", "sizeof", "smooth", "static",
		"struct", "subroutine", "superp", "switch", "template", "this", "true", "typedef", "uimage1D", "uimage1DArray", "uimage2D",
		"uimage2DArray", "uimage2DMS", "uimage2DMSArray", "uimage2DRect", "uimage3D", "uimageBuffer", "uimageCube",
		"uimageCubeArray", "uint", "uniform", "union", "unsigned", "usampler1D", "usampler1DArray", "usampler2D", "usampler2DArray",
		"usampler2DMS", "usampler2DMSArray", "usampler2DRect", "usampler3D", "usamplerBuffer", "usamplerCube",
		"usamplerCubeArray", "using", "uvec2", "uvec3", "uvec4", "varying", "vec2", "vec3", "vec4", "void", "volatile",
		"while", "writeonly",
	};
	// clang-format on

	replace_illegal_names(keywords);
}